

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O1

QNetworkInformation * __thiscall
QNetworkInformationPrivate::create(QNetworkInformationPrivate *this,QStringView name)

{
  __pointer_type pQVar1;
  QNetworkInformationBackendFactory *pQVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  QNetworkInformationBackend *backend;
  QNetworkInformation *this_00;
  long lVar6;
  QNetworkInformationBackendFactory **ppQVar7;
  QNetworkInformation *pQVar8;
  const_iterator __it;
  const_iterator cVar9;
  long in_FS_OFFSET;
  QNetworkInformationPrivate *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this != (QNetworkInformationPrivate *)0x0) &&
     (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>::guard._q_value.
                 super___atomic_base<signed_char>._M_i)) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::instance();
    bVar3 = initializeList();
    if (bVar3) {
      pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
               instance();
      if ((pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0)
      {
        LOCK();
        bVar3 = (pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p ==
                (__pointer_type)0x0;
        if (bVar3) {
          (pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
        }
        UNLOCK();
        if (!bVar3) goto LAB_001b6361;
      }
      else {
LAB_001b6361:
        QBasicMutex::lockInternal();
      }
      pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
               instance();
      pQVar8 = (pTVar5->instanceHolder)._M_t.
               super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
               super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
               super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl;
      pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
               instance();
      if (pQVar8 == (QNetworkInformation *)0x0) {
        __it.i = (pTVar5->factories).d.ptr;
        pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
                 instance();
        ppQVar7 = (pTVar5->factories).d.ptr + (pTVar5->factories).d.size;
        lVar6 = (long)ppQVar7 - (long)__it.i >> 5;
        local_48 = this;
        local_40 = name.m_size;
        if (0 < lVar6) {
          lVar6 = lVar6 + 1;
          do {
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                              ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,__it);
            cVar9.i = __it.i;
            if (bVar3) goto LAB_001b6499;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                              ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,(const_iterator)(__it.i + 1));
            cVar9.i = __it.i + 1;
            if (bVar3) goto LAB_001b6499;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                              ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,(const_iterator)(__it.i + 2));
            cVar9.i = __it.i + 2;
            if (bVar3) goto LAB_001b6499;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                              ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,(const_iterator)(__it.i + 3));
            cVar9.i = __it.i + 3;
            if (bVar3) goto LAB_001b6499;
            __it.i = __it.i + 4;
            lVar6 = lVar6 + -1;
          } while (1 < lVar6);
        }
        lVar6 = (long)ppQVar7 - (long)__it.i >> 3;
        if (lVar6 == 1) {
LAB_001b6485:
          bVar3 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>
                  ::operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,__it);
          cVar9.i = ppQVar7;
          if (bVar3) {
            cVar9.i = __it.i;
          }
        }
        else if (lVar6 == 2) {
LAB_001b646d:
          bVar3 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>
                  ::operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_48,__it);
          cVar9.i = __it.i;
          if (!bVar3) {
            __it.i = __it.i + 1;
            goto LAB_001b6485;
          }
        }
        else {
          cVar9.i = ppQVar7;
          if ((lVar6 == 3) &&
             (bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::operator()
                                ((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *
                                 )&local_48,__it), cVar9.i = __it.i, !bVar3)) {
            __it.i = __it.i + 1;
            goto LAB_001b646d;
          }
        }
LAB_001b6499:
        pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
                 instance();
        if (cVar9.i != (pTVar5->factories).d.ptr + (pTVar5->factories).d.size) {
          pQVar2 = *cVar9.i;
          (**(code **)(*(long *)pQVar2 + 0x70))(pQVar2);
          backend = (QNetworkInformationBackend *)(**(code **)(*(long *)pQVar2 + 0x68))(pQVar2);
          if (backend != (QNetworkInformationBackend *)0x0) {
            pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                     ::instance();
            this_00 = (QNetworkInformation *)operator_new(0x10);
            QNetworkInformation::QNetworkInformation(this_00,backend);
            pQVar8 = (pTVar5->instanceHolder)._M_t.
                     super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
                     super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
                     super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl;
            (pTVar5->instanceHolder)._M_t.
            super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
            super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
            super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl =
                 (QNetworkInformation *)this_00;
            if (pQVar8 != (QNetworkInformation *)0x0) {
              (**(code **)(*(long *)pQVar8 + 0x20))();
            }
            pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                     ::instance();
            goto LAB_001b637c;
          }
        }
        pQVar8 = (QNetworkInformation *)0x0;
      }
      else {
LAB_001b637c:
        pQVar8 = (pTVar5->instanceHolder)._M_t.
                 super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
                 super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
                 super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl;
      }
      LOCK();
      pQVar1 = (pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
      (pTVar4->instanceMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (pQVar1 != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(pTVar4);
      }
      goto LAB_001b6388;
    }
  }
  pQVar8 = (QNetworkInformation *)0x0;
LAB_001b6388:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar8;
}

Assistant:

QNetworkInformation *QNetworkInformationPrivate::create(QStringView name)
{
    if (name.isEmpty())
        return nullptr;
    if (!dataHolder())
        return nullptr;
#ifdef DEBUG_LOADING
    qDebug().nospace() << "create() called with name=\"" << name
                       << "\". instanceHolder initialized? " << !!dataHolder->instanceHolder;
#endif
    if (!initializeList()) {
#ifdef DEBUG_LOADING
        qDebug("Failed to initialize list, returning.");
#endif
        return nullptr;
    }

    QMutexLocker locker(&dataHolder->instanceMutex);
    if (dataHolder->instanceHolder)
        return dataHolder->instanceHolder.get();


    const auto nameMatches = [name](QNetworkInformationBackendFactory *factory) {
        return factory->name().compare(name, Qt::CaseInsensitive) == 0;
    };
    auto it = std::find_if(dataHolder->factories.cbegin(), dataHolder->factories.cend(),
                            nameMatches);
    if (it == dataHolder->factories.cend()) {
#ifdef DEBUG_LOADING
        if (dataHolder->factories.isEmpty()) {
            qDebug("No plugins available");
        } else {
            QString listNames;
            listNames.reserve(8 * dataHolder->factories.count());
            for (const auto *factory : std::as_const(dataHolder->factories))
                listNames += factory->name() + ", "_L1;
            listNames.chop(2);
            qDebug().nospace() << "Couldn't find " << name << " in list with names: { "
                                << listNames << " }";
        }
#endif
        return nullptr;
    }
#ifdef DEBUG_LOADING
    qDebug() << "Creating instance using loader named " << (*it)->name();
#endif
    QNetworkInformationBackend *backend = (*it)->create((*it)->featuresSupported());
    if (!backend)
        return nullptr;
    dataHolder->instanceHolder.reset(new QNetworkInformation(backend));
    Q_ASSERT(name.isEmpty()
             || dataHolder->instanceHolder->backendName().compare(name, Qt::CaseInsensitive) == 0);
    return dataHolder->instanceHolder.get();
}